

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *p_vector)

{
  undefined8 *puVar1;
  uint *puVar2;
  Status SVar3;
  uint uVar4;
  pointer pnVar5;
  DataKey DVar6;
  undefined8 uVar7;
  int32_t iVar8;
  Status SVar9;
  int iVar10;
  SPxStatusException *this_00;
  long lVar11;
  int i;
  long lVar12;
  ulong uVar13;
  DataKey local_b0;
  fpclass_type local_a4;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_38;
  
  if (this->initialized != false) {
    if (this->theRep == ROW) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(p_vector);
      local_a0 = &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set;
      uVar13 = (ulong)(uint)(this->thecovectors->set).thenum;
      if ((this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesense == MINIMIZE) {
        lVar11 = uVar13 * 10 + -1;
        for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
          DVar6 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).theBaseId.data[uVar13 - 1].super_DataKey;
          if (0 < DVar6.info) {
            pnVar5 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(uint *)((long)&pnVar5->m_backend + lVar11 * 8 + -0x48);
            puVar2 = (uint *)((long)&pnVar5->m_backend + lVar11 * 8 + -0x18);
            uVar7 = *(undefined8 *)(puVar2 + 2);
            result.m_backend.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
            result.m_backend.data._M_elems[0xd] = (uint)uVar7;
            result.m_backend.data._M_elems[0xe] = (uint)((ulong)uVar7 >> 0x20);
            puVar2 = (uint *)((long)&pnVar5->m_backend + lVar11 * 8 + -0x24);
            result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            uVar7 = *(undefined8 *)(puVar2 + 2);
            result.m_backend.data._M_elems[10] = (uint)uVar7;
            result.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
            puVar2 = (uint *)((long)&pnVar5->m_backend + lVar11 * 8 + -0x34);
            result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&pnVar5->m_backend + lVar11 * 8 + -0x44);
            result.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            result.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            local_a4 = *(fpclass_type *)((long)&pnVar5->m_backend + lVar11 * 8 + -8);
            uVar7 = *(undefined8 *)((long)&pnVar5->m_backend + lVar11 * 8);
            iVar8 = *(int32_t *)((long)&pnVar5->m_backend + lVar11 * 8 + -4);
            local_38 = DVar6;
            SPxColId::SPxColId((SPxColId *)&local_b0,(SPxId *)&local_38);
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(local_a0,&local_b0);
            pnVar5 = (p_vector->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar5[iVar10].m_backend.data._M_elems[0] = uVar4;
            puVar2 = (uint *)((long)&pnVar5[iVar10].m_backend.data + 0x30);
            *(ulong *)puVar2 =
                 CONCAT44(result.m_backend.data._M_elems[0xc],result.m_backend.data._M_elems[0xb]);
            *(ulong *)(puVar2 + 2) =
                 CONCAT44(result.m_backend.data._M_elems[0xe],result.m_backend.data._M_elems[0xd]);
            puVar2 = (uint *)((long)&pnVar5[iVar10].m_backend.data + 0x24);
            *(undefined8 *)puVar2 = result.m_backend.data._M_elems._32_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT44(result.m_backend.data._M_elems[0xb],result.m_backend.data._M_elems[10]);
            puVar2 = (uint *)((long)&pnVar5[iVar10].m_backend.data + 0x14);
            *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._24_8_;
            puVar2 = (uint *)((long)&pnVar5[iVar10].m_backend.data + 4);
            *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
            pnVar5[iVar10].m_backend.exp = local_a4;
            pnVar5[iVar10].m_backend.neg = (bool)((uVar4 != 0 || (int)uVar7 != 0) ^ (byte)iVar8);
            pnVar5[iVar10].m_backend.fpclass = (int)uVar7;
            pnVar5[iVar10].m_backend.prec_elem = (int)((ulong)uVar7 >> 0x20);
          }
          lVar11 = lVar11 + -10;
        }
      }
      else {
        lVar11 = uVar13 * 0x50;
        for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
          DVar6 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).theBaseId.data[uVar13 - 1].super_DataKey;
          if (0 < DVar6.info) {
            pnVar5 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b0 = DVar6;
            SPxColId::SPxColId((SPxColId *)&result,(SPxId *)&local_b0);
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(local_a0,(DataKey *)&result);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (&(p_vector->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar10].m_backend,
                       (cpp_dec_float<100U,_int,_void> *)
                       ((long)(pnVar5 + 0xffffffffffffffff) + lVar11));
          }
          lVar11 = lVar11 + -0x50;
        }
      }
    }
    else {
      lVar11 = 0;
      for (lVar12 = 0;
          lVar12 < (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar12 = lVar12 + 1) {
        SVar3 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar12];
        if (((uint)SVar3 < 9) && ((0x156U >> (SVar3 & 0x1f) & 1) != 0)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((p_vector->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11)
                     ,0);
        }
        else {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .object.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11)
                     ,(cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->thePvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar11));
          pnVar5 = (p_vector->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar11 + 0x30);
          *puVar1 = CONCAT44(result.m_backend.data._M_elems[0xd],result.m_backend.data._M_elems[0xc]
                            );
          puVar1[1] = CONCAT44(result.m_backend.data._M_elems[0xf],
                               result.m_backend.data._M_elems[0xe]);
          puVar2 = (uint *)((long)&(pnVar5->m_backend).data + lVar11 + 0x20);
          *(undefined8 *)puVar2 = result.m_backend.data._M_elems._32_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT44(result.m_backend.data._M_elems[0xb],result.m_backend.data._M_elems[10]);
          puVar2 = (uint *)((long)&(pnVar5->m_backend).data + lVar11 + 0x10);
          *(undefined8 *)puVar2 = result.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._24_8_;
          puVar2 = (uint *)((long)&(pnVar5->m_backend).data + lVar11);
          *(undefined8 *)puVar2 = result.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar5->m_backend).data + lVar11 + 0x40) = result.m_backend.exp;
          *(bool *)((long)&(pnVar5->m_backend).data + lVar11 + 0x44) = result.m_backend.neg;
          *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar11 + 0x48) = result.m_backend._72_8_
          ;
        }
        lVar11 = lVar11 + 0x50;
      }
      if ((this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesense == MINIMIZE) {
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0xbff00000;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)p_vector,(double *)&result);
      }
    }
    SVar9 = status(this);
    return SVar9;
  }
  this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&result,"XSOLVE09 No Problem loaded",(allocator *)&local_b0);
  SPxStatusException::SPxStatusException(this_00,(string *)&result);
  __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}